

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

int run_test_threadpool_cancel_work(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  int64_t eval_b;
  int64_t eval_a;
  cancel_info ci;
  uv_work_t reqs [16];
  
  ci.reqs = reqs;
  ci.nreqs = 0x10;
  ci.stride = 0x80;
  loop = (uv_loop_t *)uv_default_loop();
  saturate_threadpool();
  lVar5 = 0;
  do {
    if (lVar5 == 0x800) {
      iVar1 = uv_timer_init(loop,&ci.timer_handle);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_timer_start(&ci.timer_handle,timer_cb,10,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_run(loop,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            eval_a = 1;
            eval_b = (int64_t)timer_cb_called;
            if (eval_b == 1) {
              eval_a = 0x10;
              eval_b = (int64_t)done2_cb_called;
              if (eval_b == 0x10) {
                close_loop(loop);
                eval_a = 0;
                iVar1 = uv_loop_close(loop);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(loop)";
                pcVar3 = "0";
                uVar2 = 0x137;
              }
              else {
                pcVar4 = "done2_cb_called";
                pcVar3 = "(sizeof(reqs) / sizeof((reqs)[0]))";
                uVar2 = 0x135;
              }
            }
            else {
              pcVar4 = "timer_cb_called";
              pcVar3 = "1";
              uVar2 = 0x134;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
            uVar2 = 0x133;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)";
          uVar2 = 0x132;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_timer_init(loop, &ci.timer_handle)";
        uVar2 = 0x131;
      }
LAB_00197cb8:
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
              ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
      abort();
    }
    iVar1 = uv_queue_work(loop,(long)reqs[0].reserved + lVar5 + -0x18,work2_cb);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) {
      pcVar4 = "0";
      pcVar3 = "uv_queue_work(loop, reqs + i, work2_cb, done2_cb)";
      uVar2 = 0x12f;
      goto LAB_00197cb8;
    }
    lVar5 = lVar5 + 0x80;
  } while( true );
}

Assistant:

TEST_IMPL(threadpool_cancel_work) {
  struct cancel_info ci;
  uv_work_t reqs[16];
  uv_loop_t* loop;
  unsigned i;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  for (i = 0; i < ARRAY_SIZE(reqs); i++)
    ASSERT_OK(uv_queue_work(loop, reqs + i, work2_cb, done2_cb));

  ASSERT_OK(uv_timer_init(loop, &ci.timer_handle));
  ASSERT_OK(uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, timer_cb_called);
  ASSERT_EQ(ARRAY_SIZE(reqs), done2_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}